

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::AddKel(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
         *this,TPZFMatrix<std::complex<long_double>_> *elmat,TPZVec<long> *sourceindex,
        TPZVec<long> *destinationindex)

{
  TPZStackEqnStorage<std::complex<long_double>_> *this_00;
  TPZFrontSym<std::complex<long_double>_> *this_01;
  DecomposeType DVar1;
  int64_t maxeq;
  int64_t mineq;
  TPZEqnArray<std::complex<long_double>_> AuxEqn;
  long local_9098;
  int64_t local_9090;
  TPZEqnArray<std::complex<long_double>_> local_9088;
  
  this_01 = &this->fFront;
  TPZFrontSym<std::complex<long_double>_>::AddKel(this_01,elmat,sourceindex,destinationindex);
  EquationsToDecompose(this,destinationindex,&local_9090,&local_9098);
  TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(&local_9088);
  if (local_9090 <= local_9098) {
    TPZFrontSym<std::complex<long_double>_>::DecomposeEquations
              (this_01,local_9090,local_9098,&local_9088);
    CheckCompress(this);
    this_00 = &this->fStorage;
    TPZStackEqnStorage<std::complex<long_double>_>::AddEqnArray(this_00,&local_9088);
    if (local_9098 ==
        (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
        super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow + -1) {
      TPZFrontSym<std::complex<long_double>_>::Reset(this_01,0);
      TPZStackEqnStorage<std::complex<long_double>_>::FinishWriting(this_00);
      TPZStackEqnStorage<std::complex<long_double>_>::ReOpen(this_00);
    }
  }
  DVar1 = TPZFrontSym<std::complex<long_double>_>::GetDecomposeType(this_01);
  (this->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = (char)DVar1;
  TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray(&local_9088);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fFront.Reset(0);
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}